

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.cpp
# Opt level: O0

int __thiscall CJobPool::Init(CJobPool *this,int NumThreads)

{
  void *pvVar1;
  int in_ESI;
  int *in_RDI;
  int i;
  int local_1c;
  int iVar2;
  
  local_1c = in_ESI;
  if (0x20 < in_ESI) {
    local_1c = 0x20;
  }
  *in_RDI = local_1c;
  for (iVar2 = 0; iVar2 < *in_RDI; iVar2 = iVar2 + 1) {
    pvVar1 = thread_init((_func_void_void_ptr *)CONCAT44(in_ESI,iVar2),in_RDI);
    *(void **)(in_RDI + (long)iVar2 * 2 + 2) = pvVar1;
  }
  return 0;
}

Assistant:

int CJobPool::Init(int NumThreads)
{
	// start threads
	m_NumThreads = NumThreads > MAX_THREADS ? MAX_THREADS : NumThreads;
	for(int i = 0; i < m_NumThreads; i++)
		m_apThreads[i] = thread_init(WorkerThread, this);
	return 0;
}